

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmloutput.cpp
# Opt level: O0

XmlOutput * __thiscall XmlOutput::operator<<(XmlOutput *this,xml_output *o)

{
  XmlOutput *pXVar1;
  qsizetype qVar2;
  uint *in_RSI;
  XmlOutput *in_RDI;
  long in_FS_OFFSET;
  QString output_2;
  QString output_1;
  QString output;
  QStringBuilder<const_char_(&)[2],_QString_&> *in_stack_fffffffffffffd68;
  QString *pQVar3;
  XmlOutput *in_stack_fffffffffffffd70;
  QString *in_stack_fffffffffffffd78;
  XmlOutput *in_stack_fffffffffffffd80;
  int iVar4;
  XmlOutput *in_stack_fffffffffffffd88;
  QString *in_stack_fffffffffffffd90;
  QString *this_00;
  QString *in_stack_fffffffffffffd98;
  QString *in_stack_fffffffffffffda0;
  XmlOutput *in_stack_fffffffffffffda8;
  QChar QVar5;
  QChar local_22a [13];
  undefined8 local_210;
  undefined8 local_208;
  undefined8 local_200;
  QChar local_1f2 [13];
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  QChar local_1bc;
  QChar local_1ba [37];
  QStringBuilder<const_char_(&)[2],_QString_&> local_170;
  undefined1 local_160 [30];
  QChar local_142;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  QChar local_126;
  QChar local_124;
  QChar local_122 [64];
  QChar local_a2 [39];
  QChar local_54;
  QChar local_52 [37];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pXVar1 = (XmlOutput *)(ulong)*in_RSI;
  switch(pXVar1) {
  case (XmlOutput *)0x0:
    break;
  case (XmlOutput *)0x1:
    addRaw(in_stack_fffffffffffffd70,(QString *)in_stack_fffffffffffffd68);
    break;
  case (XmlOutput *)0x2:
    addDeclaration(in_stack_fffffffffffffd88,(QString *)in_stack_fffffffffffffd80,
                   in_stack_fffffffffffffd78);
    break;
  case (XmlOutput *)0x3:
    newTagOpen(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    break;
  case (XmlOutput *)0x4:
    QString::QString(in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffda8);
    iVar4 = (int)((ulong)in_stack_fffffffffffffd80 >> 0x20);
    QChar::QChar<char16_t,_true>(local_52,L' ');
    QString::arg<QString,_true>
              (in_stack_fffffffffffffd90,(QString *)in_stack_fffffffffffffd88,iVar4,
               (QChar)(char16_t)((ulong)pXVar1 >> 0x30));
    QChar::QChar<char16_t,_true>(&local_54,L' ');
    QString::arg<QString,_true>
              (in_stack_fffffffffffffd90,(QString *)in_stack_fffffffffffffd88,iVar4,
               (QChar)(char16_t)((ulong)pXVar1 >> 0x30));
    addRaw(in_stack_fffffffffffffd70,(QString *)in_stack_fffffffffffffd68);
    QString::~QString((QString *)0x2c191f);
    QString::~QString((QString *)0x2c192c);
    QString::~QString((QString *)0x2c1939);
    doConversion(pXVar1,(QString *)in_RDI);
    QVar5.ucs = (char16_t)((ulong)pXVar1 >> 0x30);
    addRaw(in_stack_fffffffffffffd70,(QString *)in_stack_fffffffffffffd68);
    QString::~QString((QString *)0x2c1973);
    QString::QString(in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffda8);
    QChar::QChar<char16_t,_true>(local_a2,L' ');
    QString::arg<QString,_true>
              (in_stack_fffffffffffffd90,(QString *)in_stack_fffffffffffffd88,iVar4,QVar5);
    addRaw(in_stack_fffffffffffffd70,(QString *)in_stack_fffffffffffffd68);
    QString::~QString((QString *)0x2c19eb);
    QString::~QString((QString *)0x2c19f8);
    break;
  case (XmlOutput *)0x5:
    doConversion(pXVar1,(QString *)in_RDI);
    addRaw(in_stack_fffffffffffffd70,(QString *)in_stack_fffffffffffffd68);
    QString::~QString((QString *)0x2c1a37);
    setFormat(in_RDI,NoNewLine);
    closeTag(in_stack_fffffffffffffd80);
    setFormat(in_RDI,NewLine);
    break;
  case (XmlOutput *)0x6:
    qVar2 = QString::size((QString *)(in_RSI + 8));
    if (qVar2 == 0) {
      qVar2 = QString::size((QString *)(in_RSI + 2));
      if (qVar2 == 0) {
        closeTag(in_stack_fffffffffffffd80);
      }
      else {
        closeTo(in_stack_fffffffffffffd88,(QString *)in_stack_fffffffffffffd80);
      }
    }
    else {
      closeAll(in_stack_fffffffffffffd70);
    }
    break;
  case (XmlOutput *)0x7:
    addAttribute(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    break;
  case (XmlOutput *)0x8:
    addAttributeTag(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    break;
  case (XmlOutput *)0x9:
    qVar2 = QString::size((QString *)(in_RSI + 2));
    iVar4 = (int)((ulong)in_stack_fffffffffffffd80 >> 0x20);
    if (qVar2 == 0) {
      closeOpen(in_stack_fffffffffffffd70);
    }
    else {
      local_140 = 0xaaaaaaaaaaaaaaaa;
      local_138 = 0xaaaaaaaaaaaaaaaa;
      local_130 = 0xaaaaaaaaaaaaaaaa;
      doConversion(pXVar1,(QString *)in_RDI);
      QVar5.ucs = (char16_t)((ulong)pXVar1 >> 0x30);
      QChar::QChar<char,_true>(&local_142,'\n');
      local_170 = ::operator+((char (*) [2])in_stack_fffffffffffffd70,
                              (QString *)in_stack_fffffffffffffd68);
      ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffd68);
      QString::replace((QChar)(char16_t)&local_140,(QString *)(ulong)(ushort)local_142.ucs,
                       (CaseSensitivity)local_160);
      QString::~QString((QString *)0x2c1d11);
      QString::QString(in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffda8);
      QChar::QChar<char16_t,_true>(local_1ba,L' ');
      QString::arg<QString,_true>
                (in_stack_fffffffffffffd90,(QString *)in_stack_fffffffffffffd88,iVar4,QVar5);
      QChar::QChar<char16_t,_true>(&local_1bc,L' ');
      QString::arg<QString,_true>
                (in_stack_fffffffffffffd90,(QString *)in_stack_fffffffffffffd88,iVar4,QVar5);
      addRaw(in_stack_fffffffffffffd70,(QString *)in_stack_fffffffffffffd68);
      QString::~QString((QString *)0x2c1dc3);
      QString::~QString((QString *)0x2c1dd0);
      QString::~QString((QString *)0x2c1ddd);
      QString::~QString((QString *)0x2c1dea);
    }
    break;
  case (XmlOutput *)0xa:
    QString::QString(in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffda8);
    QVar5.ucs = (char16_t)((ulong)pXVar1 >> 0x30);
    iVar4 = (int)((ulong)&in_RDI->currentIndent >> 0x20);
    QChar::QChar<char16_t,_true>(local_122,L' ');
    QString::arg<QString,_true>
              (in_stack_fffffffffffffd90,(QString *)in_stack_fffffffffffffd88,iVar4,QVar5);
    pQVar3 = (QString *)(in_RSI + 2);
    QChar::QChar<char16_t,_true>(&local_124,L' ');
    QString::arg<QString,_true>(in_stack_fffffffffffffd90,pQVar3,iVar4,QVar5);
    this_00 = (QString *)(in_RSI + 8);
    QChar::QChar<char16_t,_true>(&local_126,L' ');
    QString::arg<QString,_true>(this_00,pQVar3,iVar4,QVar5);
    addRaw(in_stack_fffffffffffffd70,(QString *)in_stack_fffffffffffffd68);
    QString::~QString((QString *)0x2c1b63);
    QString::~QString((QString *)0x2c1b70);
    QString::~QString((QString *)0x2c1b7d);
    QString::~QString((QString *)0x2c1b8a);
    break;
  case (XmlOutput *)0xb:
    local_1d8 = 0xaaaaaaaaaaaaaaaa;
    local_1d0 = 0xaaaaaaaaaaaaaaaa;
    local_1c8 = 0xaaaaaaaaaaaaaaaa;
    QString::QString(in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffda8);
    QVar5.ucs = (char16_t)((ulong)pXVar1 >> 0x30);
    iVar4 = (int)((ulong)in_stack_fffffffffffffd80 >> 0x20);
    pXVar1 = (XmlOutput *)(in_RSI + 2);
    QChar::QChar<char16_t,_true>(local_1f2,L' ');
    QString::arg<QString,_true>
              (in_stack_fffffffffffffd90,(QString *)in_stack_fffffffffffffd88,iVar4,QVar5);
    addRaw(pXVar1,(QString *)in_stack_fffffffffffffd68);
    QString::~QString((QString *)0x2c1e94);
    QString::~QString((QString *)0x2c1ea1);
    break;
  case (XmlOutput *)0xc:
    local_210 = 0xaaaaaaaaaaaaaaaa;
    local_208 = 0xaaaaaaaaaaaaaaaa;
    local_200 = 0xaaaaaaaaaaaaaaaa;
    QString::QString(in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffda8);
    QVar5.ucs = (char16_t)((ulong)pXVar1 >> 0x30);
    iVar4 = (int)((ulong)in_stack_fffffffffffffd80 >> 0x20);
    pQVar3 = (QString *)(in_RSI + 2);
    QChar::QChar<char16_t,_true>(local_22a,L' ');
    QString::arg<QString,_true>
              (in_stack_fffffffffffffd90,(QString *)in_stack_fffffffffffffd88,iVar4,QVar5);
    addRaw(in_stack_fffffffffffffd70,pQVar3);
    QString::~QString((QString *)0x2c1f3a);
    QString::~QString((QString *)0x2c1f47);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

XmlOutput& XmlOutput::operator<<(const xml_output& o)
{
    switch(o.xo_type) {
    case tNothing:
        break;
    case tRaw:
        addRaw(o.xo_text);
        break;
    case tDeclaration:
        addDeclaration(o.xo_text, o.xo_value);
        break;
    case tTag:
        newTagOpen(o.xo_text);
        break;
    case tTagValue:
        addRaw(QString("\n%1<%2>").arg(currentIndent).arg(o.xo_text));
        addRaw(doConversion(o.xo_value));
        addRaw(QString("</%1>").arg(o.xo_text));
        break;
    case tValueTag:
        addRaw(doConversion(o.xo_text));
        setFormat(NoNewLine);
        closeTag();
        setFormat(NewLine);
        break;
    case tImport:
        addRaw(QString("\n%1<Import %2=\"%3\" />").arg(currentIndent).arg(o.xo_text).arg(o.xo_value));
        break;
    case tCloseTag:
        if (o.xo_value.size())
            closeAll();
        else if (o.xo_text.size())
            closeTo(o.xo_text);
        else
            closeTag();
        break;
    case tAttribute:
        addAttribute(o.xo_text, o.xo_value);
        break;
    case tAttributeTag:
        addAttributeTag(o.xo_text, o.xo_value);
        break;
    case tData:
        {
            // Special case to be able to close tag in normal
            // way ("</tag>", not "/>") without using addRaw()..
            if (!o.xo_text.size()) {
                closeOpen();
                break;
            }
            QString output = doConversion(o.xo_text);
            output.replace('\n', "\n" + currentIndent);
            addRaw(QString("\n%1%2").arg(currentIndent).arg(output));
        }
        break;
    case tComment:
        {
            QString output("<!--%1-->");
            addRaw(output.arg(o.xo_text));
        }
        break;
    case tCDATA:
        {
            QString output("<![CDATA[\n%1\n]]>");
            addRaw(output.arg(o.xo_text));
        }
        break;
    }
    return *this;
}